

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void mqc_bypass_enc(opj_mqc_t *mqc,int d)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = mqc->ct - 1;
  mqc->ct = uVar2;
  uVar3 = (d << ((byte)uVar2 & 0x1f)) + mqc->c;
  mqc->c = uVar3;
  if (uVar2 != 0) {
    return;
  }
  puVar1 = mqc->bp;
  mqc->bp = puVar1 + 1;
  puVar1[1] = (uchar)uVar3;
  mqc->ct = 8;
  mqc->ct = (*mqc->bp != 0xff) + 7;
  mqc->c = 0;
  return;
}

Assistant:

void mqc_bypass_enc(opj_mqc_t *mqc, int d) {
	mqc->ct--;
	mqc->c = mqc->c + (d << mqc->ct);
	if (mqc->ct == 0) {
		mqc->bp++;
		*mqc->bp = mqc->c;
		mqc->ct = 8;
		if (*mqc->bp == 0xff) {
			mqc->ct = 7;
		}
		mqc->c = 0;
	}
}